

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_upgrade_tls(Curl_easy *data)

{
  _Bool _Var1;
  CURLcode CVar2;
  _Bool local_25;
  CURLcode local_24;
  _Bool ssldone;
  anon_union_280_10_9f9d5394_for_proto *paStack_20;
  CURLcode result;
  smtp_conn *smtpc;
  connectdata *conn;
  Curl_easy *data_local;
  
  smtpc = (smtp_conn *)data->conn;
  paStack_20 = &((connectdata *)smtpc)->proto;
  local_25 = false;
  conn = (connectdata *)data;
  _Var1 = Curl_conn_is_ssl((connectdata *)smtpc,0);
  if (!_Var1) {
    CVar2 = Curl_ssl_cfilter_add((Curl_easy *)conn,(connectdata *)smtpc,0);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    local_24 = 0;
  }
  local_24 = Curl_conn_connect((Curl_easy *)conn,0,false,&local_25);
  if (local_24 == CURLE_OK) {
    *(byte *)((long)paStack_20 + 0xd0) = *(byte *)((long)paStack_20 + 0xd0) & 0xfe | local_25 & 1U;
    if ((paStack_20->smtpc).state != SMTP_UPGRADETLS) {
      smtp_state((Curl_easy *)conn,SMTP_UPGRADETLS);
    }
    if ((*(byte *)((long)paStack_20 + 0xd0) & 1) != 0) {
      smtp_to_smtps((connectdata *)smtpc);
      local_24 = smtp_perform_ehlo((Curl_easy *)conn);
    }
  }
  return local_24;
}

Assistant:

static CURLcode smtp_perform_upgrade_tls(struct Curl_easy *data)
{
  /* Start the SSL connection */
  struct connectdata *conn = data->conn;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  CURLcode result;
  bool ssldone = FALSE;

  if(!Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
    result = Curl_ssl_cfilter_add(data, conn, FIRSTSOCKET);
    if(result)
      goto out;
  }

  result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssldone);
  if(!result) {
    smtpc->ssldone = ssldone;
    if(smtpc->state != SMTP_UPGRADETLS)
      smtp_state(data, SMTP_UPGRADETLS);

    if(smtpc->ssldone) {
      smtp_to_smtps(conn);
      result = smtp_perform_ehlo(data);
    }
  }
out:
  return result;
}